

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O3

int FindLatestHokuyoMessage(char *buf,int buflen,char **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  undefined1 local_3a;
  undefined1 local_39;
  undefined4 local_38;
  undefined4 local_34;
  
  uVar4 = (ulong)(uint)buflen;
  do {
    local_38 = 0;
    local_3a = 0;
    if ((int)uVar4 < 0x1d) break;
    if (((*buf == 'M') && (buf[1] == 'D')) &&
       (iVar1 = __isoc99_sscanf(buf,"MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n",&local_38,&local_38,
                                &local_38,&local_38,&local_38,&local_38,&local_3a), iVar1 == 7)) {
      uVar2 = 0x1a;
      do {
        if ((buf[uVar2 - 1] == '\n') && (buf[uVar2] == '\n')) {
LAB_0012c23c:
          *pFoundMsg = buf;
          *pFoundMsgTmpLen = (int)uVar4;
          pcVar6 = buf + 0x1d;
          pcVar5 = buf + 0x37;
          uVar4 = (ulong)((int)uVar4 - 0x1d);
          do {
            local_34 = 0;
            local_39 = 0;
            if ((int)uVar4 < 0x1d) {
              return 0;
            }
            if (((*pcVar6 == 'M') && (pcVar6[1] == 'D')) &&
               (iVar1 = __isoc99_sscanf(pcVar6,"MD%04d%04d%02d%01d%02d\n99b\n%04d%c\n",&local_34,
                                        &local_34,&local_34,&local_34,&local_34,&local_34,&local_39)
               , iVar1 == 7)) {
              lVar3 = 0;
              do {
                if ((pcVar5[lVar3 + -1] == '\n') && (buf = pcVar6, pcVar5[lVar3] == '\n'))
                goto LAB_0012c23c;
                lVar3 = lVar3 + 1;
              } while (uVar4 - 0x1a != lVar3);
            }
            pcVar6 = pcVar6 + 1;
            pcVar5 = pcVar5 + 1;
            bVar7 = uVar4 == 0x1d;
            uVar4 = uVar4 - 1;
            if (bVar7) {
              return 0;
            }
          } while( true );
        }
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    buf = buf + 1;
    bVar7 = uVar4 != 0x1d;
    uVar4 = uVar4 - 1;
  } while (bVar7);
  *pFoundMsg = (char *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindLatestHokuyoMessage(char* buf, int buflen, char** pFoundMsg, int* pFoundMsgTmpLen)
{
	char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindHokuyoMessage(buf, buflen, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected min message length.
		msglen = MIN_STANDARD_BUF_LEN_HOKUYO;

		// Search just after the message.
		if (FindHokuyoMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}